

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O3

void Wln_ObjUpdateType(Wln_Ntk_t *p,int iObj,int Type)

{
  int *piVar1;
  
  if ((-1 < iObj) && (iObj < (p->vTypes).nSize)) {
    piVar1 = (p->vTypes).pArray;
    if (piVar1[(uint)iObj] != 0) {
      __assert_fail("Wln_ObjIsNone(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                    ,0x3c,"void Wln_ObjUpdateType(Wln_Ntk_t *, int, int)");
    }
    p->nObjs[0] = p->nObjs[0] + -1;
    piVar1[(uint)iObj] = Type;
    if (iObj < (p->vTypes).nSize) {
      p->nObjs[Type] = p->nObjs[Type] + 1;
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_ObjUpdateType( Wln_Ntk_t * p, int iObj, int Type )
{
    assert( Wln_ObjIsNone(p, iObj) );
    p->nObjs[Wln_ObjType(p, iObj)]--;
    Vec_IntWriteEntry( &p->vTypes, iObj, Type );
    p->nObjs[Wln_ObjType(p, iObj)]++;
}